

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O0

void __thiscall ElfFile::loadSectionNames(ElfFile *this)

{
  Elf32_Off EVar1;
  Elf32_Word EVar2;
  reference ppEVar3;
  byte *pbVar4;
  byte *pbVar5;
  ElfSection *pEVar6;
  ulong uVar7;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string strName;
  char *name;
  int offset;
  int strTablePos_1;
  ElfSection *section;
  size_t i_1;
  size_t i;
  size_t strTableSize;
  size_t strTablePos;
  ElfFile *this_local;
  
  if ((this->fileHeader).e_shstrndx != 0) {
    ppEVar3 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::operator[]
                        (&this->sections,(ulong)(this->fileHeader).e_shstrndx);
    EVar1 = ElfSection::getOffset(*ppEVar3);
    uVar7 = (ulong)EVar1;
    ppEVar3 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::operator[]
                        (&this->sections,(ulong)(this->fileHeader).e_shstrndx);
    EVar2 = ElfSection::getSize(*ppEVar3);
    for (i_1 = 0; i_1 < EVar2; i_1 = i_1 + 1) {
      pbVar4 = ByteArray::operator[](&this->fileData,uVar7 + i_1);
      if ((*pbVar4 != '\0') &&
         (pbVar5 = ByteArray::operator[](&this->fileData,uVar7 + i_1), *pbVar5 < 0x20)) {
        return;
      }
      pbVar5 = ByteArray::operator[](&this->fileData,uVar7 + i_1);
      if (0x7f < *pbVar5) {
        return;
      }
    }
    for (section = (ElfSection *)0x0;
        pEVar6 = (ElfSection *)
                 std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::size(&this->sections),
        section < pEVar6; section = (ElfSection *)((long)&(section->header).sh_name + 1)) {
      ppEVar3 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::operator[]
                          (&this->sections,(size_type)section);
      pEVar6 = *ppEVar3;
      EVar2 = ElfSection::getType(pEVar6);
      if (EVar2 != 0) {
        ppEVar3 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::operator[]
                            (&this->sections,(ulong)(this->fileHeader).e_shstrndx);
        EVar1 = ElfSection::getOffset(*ppEVar3);
        EVar2 = ElfSection::getNameOffset(pEVar6);
        pbVar4 = ByteArray::data(&this->fileData,(long)(int)(EVar1 + EVar2));
        strName.field_2._8_8_ = pbVar4;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_68,(char *)pbVar4,&local_69);
        std::allocator<char>::~allocator(&local_69);
        ElfSection::setName(pEVar6,(string *)local_68);
        std::__cxx11::string::~string((string *)local_68);
      }
    }
  }
  return;
}

Assistant:

void ElfFile::loadSectionNames()
{
	if (fileHeader.e_shstrndx == SHN_UNDEF) return;

	// check if the string table is actually a string table
	// sometimes it gives the wrong section id
	size_t strTablePos = sections[fileHeader.e_shstrndx]->getOffset();
	size_t strTableSize = sections[fileHeader.e_shstrndx]->getSize();
	for (size_t i = 0; i < strTableSize; i++)
	{
		if (fileData[strTablePos+i] != 0 && fileData[strTablePos+i] < 0x20)
			return;
		if (fileData[strTablePos+i] > 0x7F)
			return;
	}

	for (size_t i = 0; i < sections.size(); i++)
	{
		ElfSection* section = sections[i];
		if (section->getType() == SHT_NULL) continue;

		int strTablePos = sections[fileHeader.e_shstrndx]->getOffset();
		int offset = strTablePos+section->getNameOffset();

		char* name = (char*) fileData.data(offset);
		std::string strName = name;
		section->setName(strName);
	}
}